

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::InsertHeavyRows(Codec *this)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  ushort uVar4;
  undefined2 uVar5;
  uint uVar6;
  uint uVar7;
  uint16_t *puVar8;
  uint8_t *puVar9;
  uint64_t *puVar10;
  bool bVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ushort uVar16;
  ulong uVar17;
  uint uVar18;
  
  uVar15 = this->_pivot_count;
  uVar1 = this->_defer_count;
  uVar2 = this->_dense_count;
  if (0 < (long)(int)uVar15) {
    uVar16 = uVar2 + uVar1;
    uVar3 = this->_mix_count;
    uVar17 = (ulong)uVar15;
    uVar13 = (long)(int)uVar15;
    do {
      uVar14 = uVar13 - 1;
      puVar8 = this->_pivots;
      uVar4 = puVar8[uVar13 - 1];
      if (uVar16 <= uVar4) {
        if (this->_next_pivot <= uVar14) {
          uVar17 = (ulong)((int)uVar17 - 1);
          puVar8[uVar14] = puVar8[uVar17];
          puVar8[uVar17] = uVar4;
        }
        uVar15 = this->_first_heavy_column;
        uVar18 = (uint)(ushort)(uVar3 + uVar1);
        if (uVar15 < uVar18) {
          uVar6 = this->_heavy_pitch;
          puVar9 = this->_heavy_matrix;
          uVar7 = this->_ge_pitch;
          puVar10 = this->_ge_matrix;
          do {
            puVar9[(ulong)(uVar15 - this->_first_heavy_column) +
                   (ulong)(((uint)uVar4 - (uint)uVar16) * uVar6)] =
                 (puVar10[(ulong)(uVar4 * uVar7) + (ulong)(uVar15 >> 6)] >> ((ulong)uVar15 & 0x3f) &
                 1) != 0;
            uVar15 = uVar15 + 1;
          } while (uVar18 != uVar15);
        }
      }
      uVar15 = (uint)uVar17;
      bVar11 = 1 < (long)uVar13;
      uVar13 = uVar14;
    } while (bVar11);
  }
  this->_first_heavy_pivot = uVar15;
  puVar8 = this->_pivots;
  uVar15 = this->_pivot_count;
  lVar12 = 0;
  do {
    uVar5 = this->_extra_count;
    puVar8[uVar15 + (int)lVar12] = uVar1 + uVar2 + (short)lVar12 + uVar5;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 6);
  this->_pivot_count = this->_pivot_count + 6;
  return;
}

Assistant:

void Codec::InsertHeavyRows()
{
    CAT_IF_DUMP(cout << endl << "---- InsertHeavyRows ----" << endl << endl;)

    CAT_IF_DUMP(cout << "Converting remaining extra rows to heavy...";)

    // Initialize index of first heavy pivot
    unsigned first_heavy_pivot = _pivot_count;

    const uint16_t column_count = _defer_count + _mix_count;
    const uint16_t first_heavy_row = _defer_count + _dense_count;

    // For each remaining pivot in the list:
    for (int pivot_j = (int)_pivot_count - 1; pivot_j >= 0; --pivot_j)
    {
        CAT_DEBUG_ASSERT((unsigned)pivot_j < _pivot_count);
        const uint16_t ge_row_j = _pivots[pivot_j];

        // If row is extra:
        if (ge_row_j < first_heavy_row) {
            continue;
        }

        // If pivot is still unused:
        if ((unsigned)pivot_j >= _next_pivot)
        {
            CAT_DEBUG_ASSERT(first_heavy_pivot > 0);
            --first_heavy_pivot;

            // Swap pivot j into last heavy pivot position
            CAT_DEBUG_ASSERT(first_heavy_pivot < _pivot_count);
            _pivots[pivot_j] = _pivots[first_heavy_pivot];
            _pivots[first_heavy_pivot] = ge_row_j;
        }

        CAT_IF_DUMP(cout << " row=" << ge_row_j << ", pivot=" << pivot_j;)

        CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
        uint8_t * GF256_RESTRICT extra_row = _heavy_matrix + _heavy_pitch * (ge_row_j - first_heavy_row);
        const uint64_t * GF256_RESTRICT ge_extra_row = _ge_matrix + _ge_pitch * ge_row_j;

        // Copy heavy columns to heavy matrix row

        for (unsigned ge_column_j = _first_heavy_column; ge_column_j < column_count; ++ge_column_j)
        {
            // Find bit for this column
            const uint64_t column_bit = (ge_extra_row[ge_column_j >> 6] >> (ge_column_j & 63)) & 1;

            // Set extra row byte to 0 or 1
            CAT_DEBUG_ASSERT(ge_column_j >= _first_heavy_column);
            extra_row[ge_column_j - _first_heavy_column] = static_cast<uint8_t>(column_bit);
        }
    }

    CAT_IF_DUMP(cout << endl;)

    // Store first heavy pivot index
    _first_heavy_pivot = first_heavy_pivot;

    // Add heavy rows at the end to cause them to be selected last if given a choice
    for (uint16_t heavy_i = 0; heavy_i < kHeavyRows; ++heavy_i) {
        // Use GE row index after extra count even if not all are used yet
        _pivots[_pivot_count + heavy_i] = first_heavy_row + _extra_count + heavy_i;
    }

    _pivot_count += kHeavyRows;

    CAT_IF_DUMP(cout << "Added heavy rows to the end of the pivots list." << endl;)
}